

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::NamedMDNode>::run(TypedDeleter<LLVMBC::NamedMDNode> *this)

{
  TypedDeleter<LLVMBC::NamedMDNode> *this_local;
  
  NamedMDNode::~NamedMDNode(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}